

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  _Bool _Var1;
  __int32_t **pp_Var2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  int f;
  int d;
  char str [3];
  int local_24;
  uint local_20;
  char local_1b [3];
  
  _Var1 = getn("From (default=0): ",(int *)&local_20,0);
  iVar7 = 0;
  if ((_Var1) && (_Var1 = getn("To (default=1): ",&local_24,1), iVar7 = 0, _Var1)) {
    if (local_24 < (int)local_20) {
      puts("`To` must be bigger than `from`!");
      iVar7 = 1;
    }
    else {
      uVar6 = 0;
      printf("[E]ven or [a]ny? [E/a]: ");
      fgets(local_1b,3,_stdin);
      lVar5 = (long)local_1b[0];
      if (lVar5 != 10) {
        pp_Var2 = __ctype_toupper_loc();
        uVar6 = (uint)((*pp_Var2)[lVar5] != 0x45);
      }
      uVar17 = 0;
      printf("Absolute? [y/N]: ");
      fgets(local_1b,3,_stdin);
      bVar8 = true;
      if (local_1b[0] == '\n') {
        pp_Var2 = __ctype_toupper_loc();
        bVar8 = (*pp_Var2)[10] == 0x59;
      }
      if ((int)local_20 <= local_24) {
        uVar3 = local_24 - local_20;
        uVar9 = local_20 + 1;
        uVar10 = local_20 + 2;
        uVar11 = local_20 + 3;
        uVar4 = 0;
        uVar17 = 0;
        uVar19 = 0;
        uVar21 = 0;
        uVar23 = 0;
        do {
          uVar22 = uVar23;
          uVar20 = uVar21;
          uVar18 = uVar19;
          uVar16 = uVar17;
          uVar17 = local_20;
          uVar19 = uVar9;
          uVar21 = uVar10;
          uVar23 = uVar11;
          if (bVar8) {
            uVar17 = (local_20 ^ (int)local_20 >> 0x1f) - ((int)local_20 >> 0x1f);
            uVar19 = (uVar9 ^ (int)uVar9 >> 0x1f) - ((int)uVar9 >> 0x1f);
            uVar21 = (uVar10 ^ (int)uVar10 >> 0x1f) - ((int)uVar10 >> 0x1f);
            uVar23 = (uVar11 ^ (int)uVar11 >> 0x1f) - ((int)uVar11 >> 0x1f);
          }
          uVar12 = -(uint)((int)(uVar3 ^ 0x80000000) < (int)(uVar4 ^ 0x80000000));
          uVar13 = -(uint)((int)(uVar3 ^ 0x80000000) < (int)((uVar4 | 1) ^ 0x80000000));
          uVar14 = -(uint)((int)(uVar3 ^ 0x80000000) < (int)((uVar4 | 2) ^ 0x80000000));
          uVar15 = -(uint)((int)(uVar3 ^ 0x80000000) < (int)((uVar4 | 3) ^ 0x80000000));
          uVar17 = ((int)((-(uint)((local_20 & 1) == 0) | uVar6 | uVar12) << 0x1f) >> 0x1f & uVar17)
                   + uVar16;
          uVar19 = ((int)((-(uint)((uVar9 & 1) == 0) | uVar6 | uVar13) << 0x1f) >> 0x1f & uVar19) +
                   uVar18;
          uVar21 = ((int)((-(uint)((uVar10 & 1) == 0) | uVar6 | uVar14) << 0x1f) >> 0x1f & uVar21) +
                   uVar20;
          uVar23 = ((int)((-(uint)((uVar11 & 1) == 0) | uVar6 | uVar15) << 0x1f) >> 0x1f & uVar23) +
                   uVar22;
          uVar4 = uVar4 + 4;
          local_20 = local_20 + 4;
          uVar9 = uVar9 + 4;
          uVar10 = uVar10 + 4;
          uVar11 = uVar11 + 4;
        } while ((uVar3 + 4 & 0xfffffffc) != uVar4);
        uVar17 = (~uVar15 & uVar23 | uVar22 & uVar15) + (~uVar13 & uVar19 | uVar18 & uVar13) +
                 (~uVar14 & uVar21 | uVar20 & uVar14) + (~uVar12 & uVar17 | uVar16 & uVar12);
      }
      iVar7 = 0;
      printf("The sum is %d\n",(ulong)uVar17);
    }
  }
  return iVar7;
}

Assistant:

int main(int argc, char* argv[]) {
  int d, f;
  bool even, absolute;

  if (
    !getn("From (default=0): ", &d, 0)
    || !getn("To (default=1): ", &f, 1)
  ) {return 0;}

  if (d > f) {
    printf("`To` must be bigger than `from`!\n");
    return 1;
  }

  char str[3];
  printf("[E]ven or [a]ny? [E/a]: ");
  fgets(str, sizeof str, stdin);
  even = *str == '\n' || toupper(*str) == 'E';

  printf("Absolute? [y/N]: ");
  fgets(str, sizeof str, stdin);
  absolute = *str != '\n' || toupper(*str) == 'Y';

  int sum = 0;

  for (int i = d; i <= f; i++) {
    if (!even || i % 2 == 0) sum += absolute ? abs(i) : i;
  }

  printf("The sum is %d\n", sum);

  return 0;
}